

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMan.c
# Opt level: O3

void Lpk_ManStop(Lpk_Man_t *p)

{
  uint *__ptr;
  Vec_Int_t *pVVar1;
  int *piVar2;
  void *pvVar3;
  void *__ptr_00;
  If_Man_t *p_00;
  If_Par_t *__ptr_01;
  Vec_Vec_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  int iVar7;
  long lVar8;
  
  __ptr = p->ppTruths[0][0];
  if (__ptr != (uint *)0x0) {
    free(__ptr);
    p->ppTruths[0][0] = (uint *)0x0;
  }
  pVVar1 = p->vBddDir;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vBddInv;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vMemory;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  Kit_DsdManFree(p->pDsdMan);
  lVar8 = 0x3689;
  do {
    pvVar3 = *(void **)(p->pCuts[0].uSign + lVar8 * 2 + -0xb);
    __ptr_00 = *(void **)((long)pvVar3 + 8);
    if (__ptr_00 != (void *)0x0) {
      free(__ptr_00);
    }
    free(pvVar3);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x3691);
  p_00 = p->pIfMan;
  if (p_00 != (If_Man_t *)0x0) {
    __ptr_01 = p_00->pPars;
    If_ManStop(p_00);
    if (__ptr_01 != (If_Par_t *)0x0) {
      free(__ptr_01);
    }
  }
  pVVar4 = p->vLevels;
  if (pVVar4 != (Vec_Vec_t *)0x0) {
    iVar7 = pVVar4->nSize;
    if (0 < iVar7) {
      lVar8 = 0;
      do {
        pvVar3 = pVVar4->pArray[lVar8];
        if (pvVar3 != (void *)0x0) {
          if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar3 + 8));
          }
          free(pvVar3);
          iVar7 = pVVar4->nSize;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < iVar7);
    }
    if (pVVar4->pArray != (void **)0x0) {
      free(pVVar4->pArray);
    }
    free(pVVar4);
  }
  pVVar4 = p->vVisited;
  if (pVVar4 != (Vec_Vec_t *)0x0) {
    iVar7 = pVVar4->nSize;
    if (0 < iVar7) {
      lVar8 = 0;
      do {
        pvVar3 = pVVar4->pArray[lVar8];
        if (pvVar3 != (void *)0x0) {
          if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar3 + 8));
          }
          free(pvVar3);
          iVar7 = pVVar4->nSize;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < iVar7);
    }
    if (pVVar4->pArray != (void **)0x0) {
      free(pVVar4->pArray);
    }
    free(pVVar4);
  }
  pVVar5 = p->vLeaves;
  ppvVar6 = pVVar5->pArray;
  if (ppvVar6 != (void **)0x0) {
    free(ppvVar6);
  }
  free(pVVar5);
  pVVar1 = p->vCover;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar5 = p->vTtElems;
  ppvVar6 = pVVar5->pArray;
  if (ppvVar6 != (void **)0x0) {
    free(ppvVar6);
  }
  free(pVVar5);
  pVVar5 = p->vTtNodes;
  ppvVar6 = pVVar5->pArray;
  if (ppvVar6 != (void **)0x0) {
    free(ppvVar6);
  }
  free(pVVar5);
  free(p);
  return;
}

Assistant:

void Lpk_ManStop( Lpk_Man_t * p )
{
    int i;
    ABC_FREE( p->ppTruths[0][0] );
    Vec_IntFree( p->vBddDir );
    Vec_IntFree( p->vBddInv );
    Vec_IntFree( p->vMemory );
    Kit_DsdManFree( p->pDsdMan );
    for ( i = 0; i < 8; i++ )
        Vec_IntFree(p->vSets[i]);
    if ( p->pIfMan )
    {
        void * pPars = p->pIfMan->pPars;
        If_ManStop( p->pIfMan );
        ABC_FREE( pPars );
    }
    if ( p->vLevels )
        Vec_VecFree( p->vLevels );
    if ( p->vVisited )
        Vec_VecFree( p->vVisited );
    Vec_PtrFree( p->vLeaves );
    Vec_IntFree( p->vCover );
    Vec_PtrFree( p->vTtElems );
    Vec_PtrFree( p->vTtNodes );
    ABC_FREE( p );
}